

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::TextureUnitCase::render(TextureUnitCase *this,Context *context)

{
  int iVar1;
  Texture2D *pTVar2;
  pointer pTVar3;
  TextureCube *pTVar4;
  uint uVar5;
  uint uVar6;
  deUint32 dVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int levelNdx;
  ulong uVar12;
  int face;
  size_type __n;
  long lVar13;
  reference rVar14;
  vector<unsigned_int,_std::allocator<unsigned_int>_> textureGLNames;
  ConstPixelBufferAccess access;
  Vec3 local_68;
  vector<bool,_std::allocator<bool>_> isTextureSetUp;
  
  textureGLNames.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  textureGLNames.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  textureGLNames.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  access.m_format = (TextureFormat)((ulong)access.m_format & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&isTextureSetUp,(long)this->m_numTextures,(bool *)&access,(allocator_type *)&local_68);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&textureGLNames,(long)this->m_numTextures);
  (*context->_vptr_Context[7])
            (context,(ulong)(uint)this->m_numTextures,
             textureGLNames.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  for (lVar13 = 0; lVar13 < this->m_numUnits; lVar13 = lVar13 + 1) {
    __n = (size_type)
          (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar13];
    (*context->_vptr_Context[4])(context,(ulong)((int)lVar13 + 0x84c0));
    (*context->_vptr_Context[6])
              (context,(ulong)(this->m_textureTypes).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[__n],
               (ulong)textureGLNames.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_start[__n]);
    rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](&isTextureSetUp,__n);
    if ((*rVar14._M_p & rVar14._M_mask) == 0) {
      (*context->_vptr_Context[0x1d])
                (context,(ulong)(this->m_textureTypes).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[__n],0x2802,
                 (ulong)(this->m_textureParams).
                        super__Vector_base<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                        ._M_impl.super__Vector_impl_data._M_start[__n].wrapModeS);
      (*context->_vptr_Context[0x1d])
                (context,(ulong)(this->m_textureTypes).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[__n],0x2803,
                 (ulong)(this->m_textureParams).
                        super__Vector_base<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                        ._M_impl.super__Vector_impl_data._M_start[__n].wrapModeT);
      (*context->_vptr_Context[0x1d])
                (context,(ulong)(this->m_textureTypes).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[__n],0x2801,
                 (ulong)(this->m_textureParams).
                        super__Vector_base<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                        ._M_impl.super__Vector_impl_data._M_start[__n].minFilter);
      (*context->_vptr_Context[0x1d])
                (context,(ulong)(this->m_textureTypes).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[__n],0x2800,
                 (ulong)(this->m_textureParams).
                        super__Vector_base<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                        ._M_impl.super__Vector_impl_data._M_start[__n].magFilter);
      iVar1 = (this->m_ndx2dOrCube).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[__n];
      if ((this->m_textureTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start[__n] == 0xde1) {
        pTVar2 = (this->m_textures2d).
                 super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar1];
        uVar5 = pTVar2->m_width;
        uVar9 = 1;
        if ((uVar5 & uVar5 - 1) == 0) {
          uVar6 = pTVar2->m_height;
          if ((uVar6 & uVar6 - 1) == 0) {
            if ((int)uVar6 < (int)uVar5) {
              uVar6 = uVar5;
            }
            uVar5 = 0x20;
            if (uVar6 != 0) {
              uVar5 = 0x1f;
              if (uVar6 != 0) {
                for (; uVar6 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              uVar5 = uVar5 ^ 0x1f;
            }
            uVar9 = (ulong)(0x20 - uVar5);
          }
        }
        (*context->_vptr_Context[0xf])(context,0xcf5,1);
        lVar10 = 0;
        for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    (&access,(ConstPixelBufferAccess *)
                             (*(long *)&(pTVar2->super_TextureLevelPyramid).m_access.
                                        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                        ._M_impl.super__Vector_impl_data + lVar10));
          pTVar3 = (this->m_textureParams).
                   super__Vector_base<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar8 = (ulong)pTVar3[__n].format;
          (*context->_vptr_Context[0x11])
                    (context,0xde1,uVar12 & 0xffffffff,uVar8,(ulong)(uint)access.m_size.m_data[0],
                     (ulong)(uint)access.m_size.m_data[1],0,uVar8,(ulong)pTVar3[__n].dataType,
                     access.m_data);
          lVar10 = lVar10 + 0x28;
        }
      }
      else {
        pTVar4 = (this->m_texturesCube).
                 super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>._M_impl
                 .super__Vector_impl_data._M_start[iVar1];
        uVar5 = pTVar4->m_size;
        (*context->_vptr_Context[0xf])(context,0xcf5,1);
        uVar6 = 0x20;
        if (uVar5 != 0) {
          uVar6 = 0x1f;
          if (uVar5 != 0) {
            for (; uVar5 >> uVar6 == 0; uVar6 = uVar6 - 1) {
            }
          }
          uVar6 = uVar6 ^ 0x1f;
        }
        uVar5 = uVar5 - (uVar5 >> 1 & 0x55555555);
        uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333);
        uVar9 = (ulong)(0x20 - uVar6);
        if (1 < ((uVar5 >> 4) + uVar5 & 0xf0f0f0f) * 0x1010101 >> 0x18) {
          uVar9 = 1;
        }
        for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
          lVar11 = 0;
          for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
            tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                      (&access,(ConstPixelBufferAccess *)
                               ((long)pTVar4->m_access[lVar10].
                                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar11));
            pTVar3 = (this->m_textureParams).
                     super__Vector_base<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar8 = (ulong)pTVar3[__n].format;
            (*context->_vptr_Context[0x11])
                      (context,(ulong)(uint)(&s_cubeFaceTargets)[lVar10],uVar12 & 0xffffffff,uVar8,
                       (ulong)(uint)access.m_size.m_data[0],(ulong)(uint)access.m_size.m_data[1],0,
                       uVar8,(ulong)pTVar3[__n].dataType,access.m_data);
            lVar11 = lVar11 + 0x28;
          }
        }
      }
      rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](&isTextureSetUp,__n);
      *rVar14._M_p = *rVar14._M_p | rVar14._M_mask;
    }
  }
  dVar7 = (*context->_vptr_Context[0x79])(context);
  glu::checkError(dVar7,"Set textures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureUnitTests.cpp"
                  ,900);
  dVar7 = (*context->_vptr_Context[0x75])(context,this->m_shader);
  (*context->_vptr_Context[0x2a])(0x3e000000,0x3e800000,0x3f000000,0x3f800000,context);
  (*context->_vptr_Context[0x2d])(context,0x4500);
  MultiTexShader::setUniforms(this->m_shader,context,dVar7);
  access.m_format.order = 0xbf800000;
  access.m_format.type = 0xbf800000;
  access.m_size.m_data[0] = 0;
  local_68.m_data[0] = 1.0;
  local_68.m_data[1] = 1.0;
  local_68.m_data[2] = 0.0;
  sglr::drawQuad(context,dVar7,(Vec3 *)&access,&local_68);
  dVar7 = (*context->_vptr_Context[0x79])(context);
  glu::checkError(dVar7,"Draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureUnitTests.cpp"
                  ,0x390);
  (*context->_vptr_Context[8])
            (context,(ulong)(uint)this->m_numTextures,
             textureGLNames.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar7 = (*context->_vptr_Context[0x79])(context);
  glu::checkError(dVar7,"Delete textures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureUnitTests.cpp"
                  ,0x395);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&isTextureSetUp.super__Bvector_base<std::allocator<bool>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&textureGLNames.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void TextureUnitCase::render (sglr::Context& context)
{
	// Setup textures.

	vector<deUint32>	textureGLNames;
	vector<bool>		isTextureSetUp(m_numTextures, false); // \note Same texture may be bound to multiple units, but we only want to set up parameters and data once per texture.

	textureGLNames.resize(m_numTextures);
	context.genTextures(m_numTextures, &textureGLNames[0]);

	for (int unitNdx = 0; unitNdx < m_numUnits; unitNdx++)
	{
		int texNdx = m_unitTextures[unitNdx];

		// Bind texture to unit.
		context.activeTexture(GL_TEXTURE0 + unitNdx);
		context.bindTexture(m_textureTypes[texNdx], textureGLNames[texNdx]);

		if (!isTextureSetUp[texNdx])
		{
			// Binding this texture for first time, so set parameters and data.

			context.texParameteri(m_textureTypes[texNdx], GL_TEXTURE_WRAP_S, m_textureParams[texNdx].wrapModeS);
			context.texParameteri(m_textureTypes[texNdx], GL_TEXTURE_WRAP_T, m_textureParams[texNdx].wrapModeT);
			context.texParameteri(m_textureTypes[texNdx], GL_TEXTURE_MIN_FILTER, m_textureParams[texNdx].minFilter);
			context.texParameteri(m_textureTypes[texNdx], GL_TEXTURE_MAG_FILTER, m_textureParams[texNdx].magFilter);

			if (m_textureTypes[texNdx] == GL_TEXTURE_2D)
			{
				int						ndx2d		= m_ndx2dOrCube[texNdx];
				const tcu::Texture2D*	texture		= m_textures2d[ndx2d];
				bool					mipmaps		= (deIsPowerOfTwo32(texture->getWidth()) && deIsPowerOfTwo32(texture->getHeight()));
				int						numLevels	= mipmaps ? deLog2Floor32(de::max(texture->getWidth(), texture->getHeight()))+1 : 1;

				context.pixelStorei(GL_UNPACK_ALIGNMENT, 1);

				for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
				{
					tcu::ConstPixelBufferAccess		access	= texture->getLevel(levelNdx);
					int								width	= access.getWidth();
					int								height	= access.getHeight();

					DE_ASSERT(access.getRowPitch() == access.getFormat().getPixelSize()*width);

					context.texImage2D(GL_TEXTURE_2D, levelNdx, m_textureParams[texNdx].format, width, height, 0, m_textureParams[texNdx].format, m_textureParams[texNdx].dataType, access.getDataPtr());
				}
			}
			else
			{
				DE_ASSERT(m_textureTypes[texNdx] == GL_TEXTURE_CUBE_MAP);

				int							ndxCube		= m_ndx2dOrCube[texNdx];
				const tcu::TextureCube*		texture		= m_texturesCube[ndxCube];
				bool						mipmaps		= deIsPowerOfTwo32(texture->getSize()) != DE_FALSE;
				int							numLevels	= mipmaps ? deLog2Floor32(texture->getSize())+1 : 1;

				context.pixelStorei(GL_UNPACK_ALIGNMENT, 1);

				for (int face = 0; face < (int)tcu::CUBEFACE_LAST; face++)
				{
					for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
					{
						tcu::ConstPixelBufferAccess		access	= texture->getLevelFace(levelNdx, (tcu::CubeFace)face);
						int								width	= access.getWidth();
						int								height	= access.getHeight();

						DE_ASSERT(access.getRowPitch() == access.getFormat().getPixelSize()*width);

						context.texImage2D(s_cubeFaceTargets[face], levelNdx, m_textureParams[texNdx].format, width, height, 0, m_textureParams[texNdx].format, m_textureParams[texNdx].dataType, access.getDataPtr());
					}
				}
			}

			isTextureSetUp[texNdx] = true; // Don't set up this texture's parameters and data again later.
		}
	}

	GLU_EXPECT_NO_ERROR(context.getError(), "Set textures");

	// Setup shader

	deUint32 shaderID = context.createProgram(m_shader);

	// Draw.

	context.clearColor(0.125f, 0.25f, 0.5f, 1.0f);
	context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	m_shader->setUniforms(context, shaderID);
	sglr::drawQuad(context, shaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
	GLU_EXPECT_NO_ERROR(context.getError(), "Draw");

	// Delete previously generated texture names.

	context.deleteTextures(m_numTextures, &textureGLNames[0]);
	GLU_EXPECT_NO_ERROR(context.getError(), "Delete textures");
}